

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
* __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::insert(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *this,pair<unsigned_long,_duckdb::interval_t> *value)

{
  pointer pNVar1;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar2;
  size_t sVar3;
  size_t sVar4;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar5;
  long lVar6;
  ulong uVar7;
  size_t *psVar8;
  pointer pNVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int64_t lmicros;
  long lVar14;
  int64_t ldays;
  long lVar15;
  long lVar16;
  pointer *ppNVar17;
  ulong uVar18;
  ulong uVar19;
  SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pSVar20;
  
  lVar14 = (this->_value).second.micros;
  lVar10 = (long)(this->_value).second.days + lVar14 / 86400000000;
  lVar14 = lVar14 % 86400000000;
  lVar15 = lVar10 % 0x1e;
  lVar12 = (value->second).micros;
  lVar16 = (long)(this->_value).second.months + lVar10 / 0x1e;
  lVar6 = (long)(value->second).days + lVar12 / 86400000000;
  lVar12 = lVar12 % 86400000000;
  lVar10 = lVar6 % 0x1e;
  lVar6 = (long)(value->second).months + lVar6 / 0x1e;
  if (lVar6 < lVar16) {
LAB_01a0f23b:
    pNVar5 = (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
              *)0x0;
  }
  else {
    if (lVar16 < lVar6) {
      lVar6 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar6 != 0) {
LAB_01a0f256:
        lVar14 = 1 - (lVar6 >> 4);
        do {
          pNVar5 = *(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                     **)((long)&(this->_nodeRefs)._nodes.
                                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar6);
          if ((pNVar5 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                          *)0x0) &&
             (pNVar5 = insert(pNVar5,value),
             pNVar5 != (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                        *)0x0)) {
            uVar18 = -lVar14;
            goto LAB_01a0f2d7;
          }
          lVar14 = lVar14 + 1;
          lVar6 = lVar6 + -0x10;
        } while (lVar14 != 1);
      }
    }
    else {
      if ((lVar10 < lVar15) || ((lVar10 <= lVar15 && (lVar12 < lVar14)))) goto LAB_01a0f23b;
      lVar6 = (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_nodeRefs)._nodes.
                    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar6 != 0 && (lVar14 <= lVar12 || lVar15 < lVar10)) goto LAB_01a0f256;
    }
    pNVar5 = _Pool::Allocate(this->_pool,value);
    uVar18 = 0;
LAB_01a0f2d7:
    pSVar20 = &this->_nodeRefs;
    ppNVar17 = &(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (pNVar5->_nodeRefs)._swapLevel;
    pNVar9 = (pNVar5->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = (long)(pNVar5->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4;
    pNVar1 = (pSVar20->_nodes).
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < uVar11) {
      if (uVar18 < uVar7) {
        pNVar9[uVar7].width = pNVar9[uVar7].width + pNVar1[uVar18].width;
        uVar18 = uVar18 + 1;
      }
      uVar13 = (long)*ppNVar17 - (long)pNVar1 >> 4;
      if (uVar11 < uVar13) {
        uVar13 = uVar11;
      }
      lVar14 = uVar13 - uVar18;
      if (uVar18 <= uVar13 && lVar14 != 0) {
        uVar19 = uVar18 << 4 | 8;
        do {
          pNVar1 = (pSVar20->_nodes).
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(long *)((long)&pNVar1->pNode + uVar19) =
               (*(long *)((long)&pNVar1->pNode + uVar19) - *(long *)((long)&pNVar9->pNode + uVar19))
               + 1;
          pNVar2 = pNVar1[uVar7].pNode;
          sVar3 = pNVar1[uVar7].width;
          sVar4 = pNVar9[uVar7].width;
          pNVar1[uVar7].pNode = pNVar9[uVar7].pNode;
          pNVar1[uVar7].width = sVar4;
          pNVar9 = (pNVar5->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (pNVar5->_nodeRefs)._swapLevel;
          pNVar9->pNode = pNVar2;
          pNVar9->width = sVar3;
          uVar7 = (pNVar5->_nodeRefs)._swapLevel + 1;
          (pNVar5->_nodeRefs)._swapLevel = uVar7;
          pNVar9 = (pNVar5->_nodeRefs)._nodes.
                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (long)(pNVar5->_nodeRefs)._nodes.
                         super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar9 >> 4;
          if (uVar7 < uVar11) {
            pNVar9[uVar7].width =
                 *(size_t *)
                  ((long)&((pSVar20->_nodes).
                           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pNode + uVar19);
          }
          uVar19 = uVar19 + 0x10;
          lVar14 = lVar14 + -1;
          uVar18 = uVar13;
        } while (lVar14 != 0);
      }
      if (uVar11 <= uVar7) {
        pNVar9 = (pSVar20->_nodes).
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)*ppNVar17 - (long)pNVar9 >> 4;
        lVar14 = uVar7 - uVar18;
        pNVar5 = this;
        if (uVar18 <= uVar7 && lVar14 != 0) {
          psVar8 = &pNVar9[uVar18].width;
          do {
            *psVar8 = *psVar8 + 1;
            psVar8 = psVar8 + 2;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
      }
    }
    else {
      uVar18 = (long)*ppNVar17 - (long)pNVar1 >> 4;
      lVar14 = uVar18 - uVar11;
      pNVar5 = this;
      if (uVar11 <= uVar18 && lVar14 != 0) {
        psVar8 = &pNVar1[uVar11].width;
        do {
          *psVar8 = *psVar8 + 1;
          psVar8 = psVar8 + 2;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
  }
  return pNVar5;
}

Assistant:

Node<T, _Compare> *Node<T, _Compare>::insert(const T &value) {
    assert(_nodeRefs.height());
    assert(_nodeRefs.noNodePointerMatches(this));
    assert(! _nodeRefs.canSwap());
    assert(value == value); // NaN check for double

    // Effectively: if (value < _value) {
    if (_compare(value, _value)) {
        return nullptr;
    }
    // Recursive search for where to put the node
    Node<T, _Compare> *pNode = nullptr;
    size_t level = _nodeRefs.height();
    // Effectively: if (value >= _value) {
    if (! _compare(value, _value)) {
        for (level = _nodeRefs.height(); level-- > 0;) {
            if (_nodeRefs[level].pNode) {
                pNode = _nodeRefs[level].pNode->insert(value);
                if (pNode) {
                    break;
                }
            }
        }
    }
    // Effectively: if (! pNode && value >= _value) {
    if (! pNode && !_compare(value, _value)) {
        // Insert new node here
        pNode = _pool.Allocate(value);
        level = 0;
    }
    assert(pNode); // Should never get here unless a NaN has slipped through
    // Adjust references by marching up and recursing back.
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->_nodeRefs;
    if (! thatRefs.canSwap()) {
        // Have an existing node or new node that is all swapped.
        // All I need to do is adjust my overshooting nodes and return
        // this for the caller to do the same.
        level = thatRefs.height();
        while (level < _nodeRefs.height()) {
            _nodeRefs[level].width += 1;
            ++level;
        }
        // The caller just has to increment its references that overshoot this
        assert(! _nodeRefs.canSwap());
        return this;
    }
    // March upwards
    if (level < thatRefs.swapLevel()) {
        assert(level == thatRefs.swapLevel() - 1);
        // This will happen when say a 3 high node, A, finds a 2 high
        // node, B, that creates a new 2+ high node. A will be at
        // level 1 and the new node will have swapLevel == 2 after
        // B has swapped.
        // Add the level to the accumulator at the next level
        thatRefs[thatRefs.swapLevel()].width += _nodeRefs[level].width;
        ++level;
    }
    size_t min_height = std::min(_nodeRefs.height(), thatRefs.height());
    while (level < min_height) {
        assert(thatRefs.canSwap());
        assert(level == thatRefs.swapLevel());
        assert(level < thatRefs.height());
        assert(_nodeRefs[level].width > 0);
        assert(thatRefs[level].width > 0);
        _nodeRefs[level].width -= thatRefs[level].width - 1;
        assert(_nodeRefs[level].width > 0);
        thatRefs.swap(_nodeRefs);
        if (thatRefs.canSwap()) {
            assert(thatRefs[thatRefs.swapLevel()].width == 0);
            thatRefs[thatRefs.swapLevel()].width = _nodeRefs[level].width;
        }
        ++level;
    }
    // Upwards march complete, now recurse back ('left').
    if (! thatRefs.canSwap()) {
        // All done with pNode locally.
        assert(level == thatRefs.height());
        assert(thatRefs.height() <= _nodeRefs.height());
        assert(level == thatRefs.swapLevel());
        // Adjust my overshooting nodes
        while (level < _nodeRefs.height()) {
            _nodeRefs[level].width += 1;
            ++level;
        }
        // The caller just has to increment its references that overshoot this
        assert(! _nodeRefs.canSwap());
        pNode = this;
    }
    return pNode;
}